

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
vkt::geometry::anon_unknown_0::BuiltinVariableRenderTest::initPrograms
          (BuiltinVariableRenderTest *this,SourceCollections *sourceCollections)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  VariableTest VVar3;
  char *pcVar4;
  size_t sVar5;
  ProgramSources *pPVar6;
  long lVar7;
  ostringstream src;
  undefined1 auStack_218 [8];
  long *local_210;
  long local_208;
  long local_200 [2];
  string local_1f0;
  uint local_1d0;
  value_type local_1c8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out gl_PerVertex\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," {\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tvec4 gl_Position;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tfloat gl_PointSize;\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"};\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in vec4 a_position;\n",0x29);
  VVar3 = this->m_test;
  if (VVar3 == TEST_POINT_SIZE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 1) in vec4 a_pointSize;\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) out vec4 v_geom_pointSize;\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_Position = a_position;\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_PointSize = 1.0;\n",0x15);
    lVar7 = 0x21;
    pcVar4 = "\tv_geom_pointSize = a_pointSize;\n";
LAB_009dbfc7:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,lVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  }
  else {
    if (VVar3 == TEST_PRIMITIVE_ID_IN) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
      lVar7 = 0x1b;
      pcVar4 = "\tgl_Position = a_position;\n";
      goto LAB_009dbfc7;
    }
    if (VVar3 == TEST_PRIMITIVE_ID) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(location = 1) in vec4 a_primitiveID;\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(location = 0) out vec4 v_geom_primitiveID;\n",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\tgl_Position = a_position;\n",0x1b);
      lVar7 = 0x25;
      pcVar4 = "\tv_geom_primitiveID = a_primitiveID;\n";
      goto LAB_009dbfc7;
    }
  }
  paVar1 = &local_1f0.field_2;
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"vertex","");
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  local_1d0 = 0;
  paVar2 = &local_1c8.field_2;
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_210,local_208 + (long)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar6->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in gl_PerVertex\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tvec4 gl_Position;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tfloat gl_PointSize;\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"} gl_in[];\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out gl_PerVertex\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tvec4 gl_Position;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tfloat gl_PointSize;\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"};\n",3);
  VVar3 = this->m_test;
  if (VVar3 == TEST_POINT_SIZE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"#extension GL_EXT_geometry_point_size : require\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(points) in;\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(points, max_vertices = 1) out;\n",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) in vec4 v_geom_pointSize[];\n",0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) out vec4 v_frag_FragColor;\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_Position = gl_in[0].gl_Position;\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_PointSize = v_geom_pointSize[0].x + 1.0;\n",0x2d);
    lVar7 = 0x2e;
    pcVar4 = "\tv_frag_FragColor = vec4(1.0, 1.0, 1.0, 1.0);\n";
LAB_009dc5a0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,lVar7);
    lVar7 = 0xf;
    pcVar4 = "\tEmitVertex();\n";
LAB_009dc5bc:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,lVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  }
  else {
    if (VVar3 == TEST_PRIMITIVE_ID_IN) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(lines) in;\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(triangle_strip, max_vertices = 10) out;\n",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(location = 0) out vec4 v_frag_FragColor;\n",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\tconst vec4 red = vec4(1.0, 0.0, 0.0, 1.0);\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\tconst vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\tconst vec4 blue = vec4(0.0, 0.0, 1.0, 1.0);\n",0x2d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\tconst vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "\tconst vec4 colors[4] = vec4[4](red, green, blue, yellow);\n",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "\tfor (float percent=0.00; percent < 0.30; percent+=0.10)\n{\n",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "\t\tgl_Position = gl_in[0].gl_Position * vec4(1.0+percent, 1.0+percent, 1.0, 1.0);\n"
                 ,0x51);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\t\tv_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n",0x33)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\t\tEmitVertex();\n",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "\t\tgl_Position = gl_in[1].gl_Position * vec4(1.0+percent, 1.0+percent, 1.0, 1.0);\n"
                 ,0x51);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\t\tv_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n",0x33)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\t\tEmitVertex();\n",0x10);
      lVar7 = 3;
      pcVar4 = "\t}\n";
      goto LAB_009dc5bc;
    }
    if (VVar3 == TEST_PRIMITIVE_ID) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(points, invocations=1) in;\n",0x22);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(triangle_strip, max_vertices = 3) out;\n",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(location = 0) in vec4 v_geom_primitiveID[];\n",0x33);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "\tgl_Position = gl_in[0].gl_Position + vec4(0.05, 0.0, 0.0, 0.0);\n",0x41);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "\tgl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\tEmitVertex();\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "\tgl_Position = gl_in[0].gl_Position - vec4(0.05, 0.0, 0.0, 0.0);\n",0x41);
      pcVar4 = "\tgl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "\tgl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\tEmitVertex();\n",0xf);
      lVar7 = 0x3b;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "\tgl_Position = gl_in[0].gl_Position + vec4(0.0, 0.05, 0.0, 0.0);\n",0x41);
      goto LAB_009dc5a0;
    }
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"geometry","");
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  local_1d0 = 2;
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_210,local_208 + (long)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar6->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  if (this->m_test < TEST_PRIMITIVE_ID) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) out vec4 fragColor;\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) in vec4 v_frag_FragColor;\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
    lVar7 = 0x1f;
    pcVar4 = "\tfragColor = v_frag_FragColor;\n";
  }
  else {
    if (this->m_test != TEST_PRIMITIVE_ID) goto LAB_009dc873;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) out vec4 fragColor;\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tconst vec4 red\t\t\t= vec4(1.0, 0.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tconst vec4 green\t\t= vec4(0.0, 1.0, 0.0, 1.0);\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tconst vec4 blue\t\t\t= vec4(0.0, 0.0, 1.0, 1.0);\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tconst vec4 yellow\t\t= vec4(1.0, 1.0, 0.0, 1.0);\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tconst vec4 colors[4]\t= vec4[4](yellow, red, green, blue);\n"
               ,0x3b);
    lVar7 = 0x29;
    pcVar4 = "\tfragColor = colors[gl_PrimitiveID % 4];\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,lVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
LAB_009dc873:
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"fragment","");
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  local_1d0 = 1;
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_210,local_208 + (long)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar6->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void BuiltinVariableRenderTest::initPrograms (SourceCollections& sourceCollections) const
{
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "out gl_PerVertex\n"
			<<" {\n"
			<< "	vec4 gl_Position;\n"
			<< "	float gl_PointSize;\n"
			<< "};\n"
			<< "layout(location = 0) in vec4 a_position;\n";
		switch(m_test)
		{
			case TEST_POINT_SIZE:
				src	<< "layout(location = 1) in vec4 a_pointSize;\n"
					<< "layout(location = 0) out vec4 v_geom_pointSize;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = a_position;\n"
					<< "	gl_PointSize = 1.0;\n"
					<< "	v_geom_pointSize = a_pointSize;\n"
					<< "}\n";
				break;
			case TEST_PRIMITIVE_ID_IN:
				src	<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = a_position;\n"
					<< "}\n";
				break;
			case TEST_PRIMITIVE_ID:
				src	<< "layout(location = 1) in vec4 a_primitiveID;\n"
					<< "layout(location = 0) out vec4 v_geom_primitiveID;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = a_position;\n"
					<< "	v_geom_primitiveID = a_primitiveID;\n"
					<< "}\n";
				break;
			default:
				DE_ASSERT(0);
				break;
		}
		sourceCollections.glslSources.add("vertex") << glu::VertexSource(src.str());
	}

	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "in gl_PerVertex\n"
			<<"{\n"
			<< "	vec4 gl_Position;\n"
			<< "	float gl_PointSize;\n"
			<< "} gl_in[];\n"
			<< "out gl_PerVertex\n"
			<<"{\n"
			<< "	vec4 gl_Position;\n"
			<< "	float gl_PointSize;\n"
			<< "};\n";
		switch(m_test)
		{
			case TEST_POINT_SIZE:
				src	<< "#extension GL_EXT_geometry_point_size : require\n"
					<< "layout(points) in;\n"
					<< "layout(points, max_vertices = 1) out;\n"
					<< "layout(location = 0) in vec4 v_geom_pointSize[];\n"
					<< "layout(location = 0) out vec4 v_frag_FragColor;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = gl_in[0].gl_Position;\n"
					<< "	gl_PointSize = v_geom_pointSize[0].x + 1.0;\n"
					<< "	v_frag_FragColor = vec4(1.0, 1.0, 1.0, 1.0);\n"
					<< "	EmitVertex();\n"
					<< "}\n";
				break;
			case TEST_PRIMITIVE_ID_IN:
				src	<< "layout(lines) in;\n"
					<< "layout(triangle_strip, max_vertices = 10) out;\n"
					<< "layout(location = 0) out vec4 v_frag_FragColor;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	const vec4 red = vec4(1.0, 0.0, 0.0, 1.0);\n"
					<< "	const vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
					<< "	const vec4 blue = vec4(0.0, 0.0, 1.0, 1.0);\n"
					<< "	const vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
					<< "	const vec4 colors[4] = vec4[4](red, green, blue, yellow);\n"
					<< "	for (float percent=0.00; percent < 0.30; percent+=0.10)\n"
							"{\n"
					<< "		gl_Position = gl_in[0].gl_Position * vec4(1.0+percent, 1.0+percent, 1.0, 1.0);\n"
					<< "		v_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n"
					<< "		EmitVertex();\n"
					<< "		gl_Position = gl_in[1].gl_Position * vec4(1.0+percent, 1.0+percent, 1.0, 1.0);\n"
					<< "		v_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n"
					<< "		EmitVertex();\n"
					<< "	}\n"
					<< "}\n";
				break;
			case TEST_PRIMITIVE_ID:
				src	<< "layout(points, invocations=1) in;\n"
					<< "layout(triangle_strip, max_vertices = 3) out;\n"
					<< "layout(location = 0) in vec4 v_geom_primitiveID[];\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = gl_in[0].gl_Position + vec4(0.05, 0.0, 0.0, 0.0);\n"
					<< "	gl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n"
					<< "	EmitVertex();\n"
					<< "	gl_Position = gl_in[0].gl_Position - vec4(0.05, 0.0, 0.0, 0.0);\n"
					<< "	gl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n"
					<< "	EmitVertex();\n"
					<< "	gl_Position = gl_in[0].gl_Position + vec4(0.0, 0.05, 0.0, 0.0);\n"
					<< "	gl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n"
					<< "	EmitVertex();\n"
					<< "}\n";
				break;
			default:
				DE_ASSERT(0);
				break;
		}
		sourceCollections.glslSources.add("geometry") << glu::GeometrySource(src.str());
	}

	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n";
		switch(m_test)
		{
			case TEST_POINT_SIZE:
				src	<< "layout(location = 0) out vec4 fragColor;\n"
					<< "layout(location = 0) in vec4 v_frag_FragColor;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	fragColor = v_frag_FragColor;\n"
					<< "}\n";
				break;
			case TEST_PRIMITIVE_ID_IN:
				src	<< "layout(location = 0) out vec4 fragColor;\n"
					<< "layout(location = 0) in vec4 v_frag_FragColor;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	fragColor = v_frag_FragColor;\n"
					<< "}\n";
				break;
			case TEST_PRIMITIVE_ID:
				src	<< "layout(location = 0) out vec4 fragColor;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	const vec4 red			= vec4(1.0, 0.0, 0.0, 1.0);\n"
					<< "	const vec4 green		= vec4(0.0, 1.0, 0.0, 1.0);\n"
					<< "	const vec4 blue			= vec4(0.0, 0.0, 1.0, 1.0);\n"
					<< "	const vec4 yellow		= vec4(1.0, 1.0, 0.0, 1.0);\n"
					<< "	const vec4 colors[4]	= vec4[4](yellow, red, green, blue);\n"
					<< "	fragColor = colors[gl_PrimitiveID % 4];\n"
					<< "}\n";
				break;
			default:
				DE_ASSERT(0);
				break;
		}
		sourceCollections.glslSources.add("fragment") << glu::FragmentSource(src.str());
	}
}